

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.c
# Opt level: O3

long oggpack_look(oggpack_buffer *b,int bits)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  byte *pbVar4;
  uint uVar5;
  ogg_reference *poVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  
  iVar1 = b->headbit;
  uVar5 = bits + iVar1;
  uVar9 = b->headend;
  bVar3 = (byte)iVar1;
  if (uVar9 * 8 - (long)(int)uVar5 == 0 || (long)(uVar9 * 8) < (long)(int)uVar5) {
    if ((int)uVar9 < 0) {
      return -1;
    }
    if (uVar5 == 0) {
      uVar7 = 0xffffffffffffffff;
      goto LAB_00135042;
    }
    poVar6 = b->head;
    if ((int)uVar9 == 0) {
      do {
        poVar6 = poVar6->next;
        if (poVar6 == (ogg_reference *)0x0) {
          return -1;
        }
        uVar2 = (uint)poVar6->length;
        uVar9 = (ulong)uVar2;
      } while (uVar2 == 0);
      pbVar4 = poVar6->buffer->data + poVar6->begin;
    }
    else {
      pbVar4 = b->headptr;
    }
    uVar7 = (ulong)(*pbVar4 >> (bVar3 & 0x1f));
    if ((int)uVar5 < 9) goto LAB_00135042;
    iVar8 = (int)uVar9 + -1;
    if (iVar8 == 0) {
      do {
        poVar6 = poVar6->next;
        if (poVar6 == (ogg_reference *)0x0) {
          return -1;
        }
        iVar8 = (int)poVar6->length;
      } while (iVar8 == 0);
      pbVar4 = poVar6->buffer->data + poVar6->begin;
    }
    else {
      pbVar4 = pbVar4 + 1;
    }
    uVar7 = (long)(int)((uint)*pbVar4 << (8 - bVar3 & 0x1f)) | uVar7;
    if ((int)uVar5 < 0x11) goto LAB_00135042;
    iVar8 = iVar8 + -1;
    if (iVar8 == 0) {
      do {
        poVar6 = poVar6->next;
        if (poVar6 == (ogg_reference *)0x0) {
          return -1;
        }
        iVar8 = (int)poVar6->length;
      } while (iVar8 == 0);
      pbVar4 = poVar6->buffer->data + poVar6->begin;
    }
    else {
      pbVar4 = pbVar4 + 1;
    }
    uVar7 = uVar7 | (long)(int)((uint)*pbVar4 << (0x10 - bVar3 & 0x1f));
    if ((int)uVar5 < 0x19) goto LAB_00135042;
    iVar8 = iVar8 + -1;
    if (iVar8 == 0) {
      do {
        poVar6 = poVar6->next;
        if (poVar6 == (ogg_reference *)0x0) {
          return -1;
        }
        iVar8 = (int)poVar6->length;
      } while (iVar8 == 0);
      pbVar4 = poVar6->buffer->data + poVar6->begin;
    }
    else {
      pbVar4 = pbVar4 + 1;
    }
    uVar7 = uVar7 | (long)(int)((uint)*pbVar4 << (0x18 - bVar3 & 0x1f));
    if (iVar1 == 0 || (int)uVar5 < 0x21) goto LAB_00135042;
    if (iVar8 == 1) {
      do {
        poVar6 = poVar6->next;
        if (poVar6 == (ogg_reference *)0x0) {
          return -1;
        }
      } while ((int)poVar6->length == 0);
      pbVar4 = poVar6->buffer->data + poVar6->begin;
    }
    else {
      pbVar4 = pbVar4 + 1;
    }
  }
  else {
    pbVar4 = b->headptr;
    uVar7 = (ulong)(*pbVar4 >> (bVar3 & 0x1f));
    if (((((int)uVar5 < 9) ||
         (uVar7 = (long)(int)((uint)pbVar4[1] << (8 - bVar3 & 0x1f)) | uVar7, uVar5 < 0x11)) ||
        (uVar7 = uVar7 | (long)(int)((uint)pbVar4[2] << (0x10 - bVar3 & 0x1f)), uVar5 < 0x19)) ||
       (uVar7 = uVar7 | (long)(int)((uint)pbVar4[3] << (0x18 - bVar3 & 0x1f)),
       iVar1 == 0 || uVar5 < 0x21)) goto LAB_00135042;
    pbVar4 = pbVar4 + 4;
  }
  uVar7 = (long)(int)((uint)*pbVar4 << (-bVar3 & 0x1f)) | uVar7;
LAB_00135042:
  return uVar7 & mask[bits];
}

Assistant:

long oggpack_look(oggpack_buffer *b,int bits){
  unsigned long m=mask[bits];
  unsigned long ret=-1;

  bits+=b->headbit;

  if(bits >= b->headend<<3){
    int            end=b->headend;
    unsigned char *ptr=b->headptr;
    ogg_reference *head=b->head;

    if(end<0)return -1;
    
    if(bits){
      _lookspan();
      ret=*ptr++>>b->headbit;
      if(bits>8){
        --end;
        _lookspan();
        ret|=*ptr++<<(8-b->headbit);  
        if(bits>16){
          --end;
          _lookspan();
          ret|=*ptr++<<(16-b->headbit);  
          if(bits>24){
            --end;
            _lookspan();
            ret|=*ptr++<<(24-b->headbit);  
            if(bits>32 && b->headbit){
              --end;
              _lookspan();
              ret|=*ptr<<(32-b->headbit);
            }
          }
        }
      }
    }

  }else{

    /* make this a switch jump-table */
    ret=b->headptr[0]>>b->headbit;
    if(bits>8){
      ret|=b->headptr[1]<<(8-b->headbit);  
      if(bits>16){
        ret|=b->headptr[2]<<(16-b->headbit);  
        if(bits>24){
          ret|=b->headptr[3]<<(24-b->headbit);  
          if(bits>32 && b->headbit)
            ret|=b->headptr[4]<<(32-b->headbit);
        }
      }
    }
  }

  ret&=m;
  return ret;
}